

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O0

int add_cipher_oid(CBB *out,int nid)

{
  int iVar1;
  anon_struct_24_4_403183fb *cipher;
  anon_struct_24_4_403183fb *__end1;
  anon_struct_24_4_403183fb *__begin1;
  anon_struct_24_4_403183fb (*__range1) [5];
  int nid_local;
  CBB *out_local;
  
  __end1 = kCipherOIDs;
  while( true ) {
    if (__end1 == (anon_struct_24_4_403183fb *)&DAT_0041b9a8) {
      ERR_put_error(0x13,0,0x7f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                    ,0x62);
      return 0;
    }
    if (__end1->nid == nid) break;
    __end1 = __end1 + 1;
  }
  iVar1 = CBB_add_asn1_element(out,6,__end1->oid,(ulong)__end1->oid_len);
  return iVar1;
}

Assistant:

static int add_cipher_oid(CBB *out, int nid) {
  for (const auto &cipher : kCipherOIDs) {
    if (cipher.nid == nid) {
      return CBB_add_asn1_element(out, CBS_ASN1_OBJECT, cipher.oid,
                                  cipher.oid_len);
    }
  }

  OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_CIPHER);
  return 0;
}